

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_init(mpack_tree_t *tree,char *data,size_t length)

{
  size_t length_local;
  char *data_local;
  mpack_tree_t *tree_local;
  
  mpack_tree_init_clear(tree);
  tree->data = data;
  tree->data_length = length;
  tree->pool = (mpack_node_data_t *)0x0;
  tree->pool_count = 0;
  tree->next = (mpack_tree_page_t *)0x0;
  return;
}

Assistant:

void mpack_tree_init(mpack_tree_t* tree, const char* data, size_t length) {
    mpack_tree_init_clear(tree);

    MPACK_STATIC_ASSERT(MPACK_NODE_PAGE_SIZE >= sizeof(mpack_tree_page_t),
            "MPACK_NODE_PAGE_SIZE is too small");

    MPACK_STATIC_ASSERT(MPACK_PAGE_ALLOC_SIZE <= MPACK_NODE_PAGE_SIZE,
            "incorrect page rounding?");

    tree->data = data;
    tree->data_length = length;
    tree->pool = NULL;
    tree->pool_count = 0;
    tree->next = NULL;

    mpack_log("===========================\n");
    mpack_log("initializing tree with data of size %i\n", (int)length);
}